

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.hpp
# Opt level: O2

void __thiscall
Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::~TypeRecipient
          (TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper> *this)

{
  (this->super_Delegate).super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0058af58;
  std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::~unique_ptr
            (&this->previous_typer_);
  std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::~unique_ptr(&this->typer_);
  return;
}

Assistant:

TypeRecipient(Args&&... args) : character_mapper(std::forward<Args>(args)...) {}